

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

bool anon_unknown.dwarf_41b5d::SetSourceiv
               (ALsource *Source,ALCcontext *Context,SourceProp prop,
               span<const_int,_18446744073709551615UL> values)

{
  span<const_float,_18446744073709551615UL> values_00;
  span<const_float,_18446744073709551615UL> values_01;
  span<const_float,_18446744073709551615UL> values_02;
  ALsource *source;
  uint uVar1;
  Voice *voice_00;
  BufferlistItem *pBVar2;
  pointer pBVar3;
  ALbuffer *pAVar4;
  index_type iVar5;
  reference piVar6;
  DirectMode *pDVar7;
  DistanceModel *pDVar8;
  Resampler *pRVar9;
  SpatializeMode *pSVar10;
  uint *puVar11;
  reference pvVar12;
  uint in_EDX;
  ALCcontext *in_RSI;
  ALsource *in_RDI;
  bool bVar13;
  ALeffectslot *oldslot_1;
  Voice *voice_2;
  ALeffectslot *oldslot;
  value_type *send_1;
  value_type *send;
  ALfilter *filter_1;
  lock_guard<std::mutex> __2;
  optional<SpatializeMode> mode_1;
  optional<DirectMode> mode;
  ALfilter *filter;
  lock_guard<std::mutex> __1;
  optional<(anonymous_namespace)::VoicePos> vpos;
  Voice *voice_1;
  BufferStorage *buffer_1;
  unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> temp;
  BufferlistItem *newlist;
  ALbuffer *buffer;
  lock_guard<std::mutex> _;
  ALenum state;
  Voice *voice;
  float fvals [6];
  unique_lock<std::mutex> slotlock;
  BufferlistItem *oldlist;
  ALeffectslot *slot;
  ALCdevice *device;
  memory_order __b;
  pointer in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff990;
  memory_order in_stack_fffffffffffff994;
  ALCcontext *in_stack_fffffffffffff998;
  ALsource *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  ALCcontext *in_stack_fffffffffffff9b0;
  ALuint AVar14;
  ALCdevice *in_stack_fffffffffffff9b8;
  ALsource *in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  ALenum mode_00;
  undefined4 in_stack_fffffffffffffa28;
  undefined2 in_stack_fffffffffffffa2c;
  undefined1 in_stack_fffffffffffffa2e;
  undefined1 in_stack_fffffffffffffa2f;
  undefined8 in_stack_fffffffffffffa30;
  ALenum OffsetType;
  BufferlistItem *in_stack_fffffffffffffa38;
  ALCdevice *in_stack_fffffffffffffa88;
  atomic_flag *paVar15;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  ALsource *in_stack_fffffffffffffa98;
  VoicePos *in_stack_fffffffffffffaa0;
  ALeffectslot *pAVar16;
  Voice *in_stack_fffffffffffffaa8;
  SourceProp in_stack_fffffffffffffc3c;
  ALCcontext *in_stack_fffffffffffffc40;
  ALCcontext *this;
  ALsource *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  pointer in_stack_fffffffffffffc58;
  span<const_float,_18446744073709551615UL> local_198;
  span<const_float,_18446744073709551615UL> local_188;
  span<const_float,_18446744073709551615UL> local_178;
  ALeffectslot *local_168;
  Voice *local_160;
  ALeffectslot *local_158;
  reference local_150;
  reference local_148;
  ALfilter *local_140;
  optional<SpatializeMode> local_11e [2];
  optional<DirectMode> local_11a;
  ALfilter *local_118;
  optional<(anonymous_namespace)::VoicePos> local_f0;
  Voice *local_d8;
  BufferStorage *local_d0;
  BufferlistItem *local_c0;
  ALbuffer *local_b8;
  ALenum local_a4;
  Voice *local_a0;
  uint local_98;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  unique_lock<std::mutex> local_68;
  __pointer_type local_58;
  ALeffectslot *local_50;
  ALCdevice *local_48;
  uint local_3c;
  ALCcontext *local_38;
  ALsource *local_30;
  span<const_int,_18446744073709551615UL> local_28;
  byte local_11;
  memory_order local_10;
  int local_c;
  atomic_flag *local_8;
  
  OffsetType = (ALenum)((ulong)in_stack_fffffffffffffa30 >> 0x20);
  mode_00 = (ALenum)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
  local_3c = in_EDX;
  local_38 = in_RSI;
  local_30 = in_RDI;
  local_48 = al::intrusive_ptr<ALCdevice>::get(&in_RSI->mDevice);
  local_50 = (ALeffectslot *)0x0;
  local_58 = (__pointer_type)0x0;
  std::unique_lock<std::mutex>::unique_lock(&local_68);
  if (local_3c == 0x202) {
    iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
    bVar13 = true;
    if (iVar5 != 1) {
      iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
      bVar13 = iVar5 == 6;
    }
    if (bVar13) {
      piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
      bVar13 = true;
      if (*piVar6 != 0) {
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
        bVar13 = *piVar6 == 1;
      }
      if (bVar13) {
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
        local_30->HeadRelative = *piVar6 != 0;
        local_11 = UpdateSourceProps(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
        local_98 = 1;
      }
      else {
        ALCcontext::setError(local_38,0xa003,"Value out of range");
        local_11 = 0;
        local_98 = 1;
      }
    }
    else {
      iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
      ALCcontext::setError
                (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_3c,1,
                 iVar5);
      local_11 = 0;
      local_98 = 1;
    }
    goto LAB_001649e5;
  }
  if (local_3c - 0x1001 < 3) goto LAB_001643dd;
  if (local_3c - 0x1004 < 3) {
    iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
    bVar13 = true;
    if (iVar5 != 3) {
      iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
      bVar13 = iVar5 == 6;
    }
    if (bVar13) {
      piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
      local_88 = (float)*piVar6;
      piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,1);
      local_84 = (float)*piVar6;
      piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,2);
      local_80 = (float)*piVar6;
      al::span<const_float,_18446744073709551615UL>::span(&local_188,&local_88,3);
      values_01.mData._7_1_ = in_stack_fffffffffffffc57;
      values_01.mData._0_7_ = in_stack_fffffffffffffc50;
      values_01.mDataEnd = in_stack_fffffffffffffc58;
      local_11 = SetSourcefv(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                             in_stack_fffffffffffffc3c,values_01);
      local_98 = 1;
    }
    else {
      iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
      ALCcontext::setError
                (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_3c,3,
                 iVar5);
      local_11 = 0;
      local_98 = 1;
    }
    goto LAB_001649e5;
  }
  if (local_3c == 0x1007) {
    iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
    bVar13 = true;
    if (iVar5 != 1) {
      iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
      bVar13 = iVar5 == 6;
    }
    if (bVar13) {
      piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
      bVar13 = true;
      if (*piVar6 != 0) {
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
        bVar13 = *piVar6 == 1;
      }
      if (bVar13) {
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
        local_30->Looping = *piVar6 != 0;
        bVar13 = IsPlayingOrPaused(local_30);
        if ((bVar13) &&
           (local_a0 = GetSourceVoice(in_stack_fffffffffffff9c0,
                                      (ALCcontext *)in_stack_fffffffffffff9b8),
           local_a0 != (Voice *)0x0)) {
          if ((local_30->Looping & 1U) == 0) {
            std::atomic<BufferlistItem_*>::store
                      ((atomic<BufferlistItem_*> *)in_stack_fffffffffffff9a0,
                       (__pointer_type)in_stack_fffffffffffff998,in_stack_fffffffffffff994);
          }
          else {
            std::atomic<BufferlistItem_*>::store
                      ((atomic<BufferlistItem_*> *)in_stack_fffffffffffff9a0,
                       (__pointer_type)in_stack_fffffffffffff998,in_stack_fffffffffffff994);
          }
          ALCdevice::waitForMix
                    ((ALCdevice *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        local_11 = 1;
        local_98 = 1;
      }
      else {
        ALCcontext::setError(local_38,0xa003,"Value out of range");
        local_11 = 0;
        local_98 = 1;
      }
    }
    else {
      iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
      ALCcontext::setError
                (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_3c,1,
                 iVar5);
      local_11 = 0;
      local_98 = 1;
    }
    goto LAB_001649e5;
  }
  if (local_3c == 0x1009) {
    iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
    AVar14 = (ALuint)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
    bVar13 = true;
    if (iVar5 != 1) {
      iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
      bVar13 = iVar5 == 6;
    }
    source = local_30;
    if (bVar13) {
      voice_00 = GetSourceVoice(in_stack_fffffffffffff9c0,(ALCcontext *)in_stack_fffffffffffff9b8);
      local_a4 = GetSourceState(source,voice_00);
      if ((local_a4 == 0x1012) || (local_a4 == 0x1013)) {
        ALCcontext::setError
                  (local_38,0xa004,"Setting buffer on playing or paused source %u",
                   (ulong)local_30->id);
        local_11 = 0;
        local_98 = 1;
      }
      else {
        local_58 = local_30->queue;
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
        if (*piVar6 == 0) {
          local_30->SourceType = 0x1030;
          local_30->queue = (BufferlistItem *)0x0;
        }
        else {
          std::lock_guard<std::mutex>::lock_guard
                    ((lock_guard<std::mutex> *)
                     CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                     (mutex_type *)in_stack_fffffffffffff988);
          al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
          local_b8 = LookupBuffer(in_stack_fffffffffffff9b8,AVar14);
          if (local_b8 == (ALbuffer *)0x0) {
            puVar11 = (uint *)al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
            ALCcontext::setError(local_38,0xa003,"Invalid buffer ID %u",(ulong)*puVar11);
            local_11 = 0;
            local_98 = 1;
          }
          else if ((local_b8->MappedAccess == 0) || ((local_b8->MappedAccess & 4) != 0)) {
            if (((local_b8->mBuffer).mCallback == (CallbackType)0x0) ||
               (uVar1 = ReadRef((RefCount *)in_stack_fffffffffffff998), uVar1 == 0)) {
              pBVar2 = (BufferlistItem *)
                       BufferlistItem::operator_new
                                 (CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
              std::atomic<BufferlistItem_*>::atomic
                        ((atomic<BufferlistItem_*> *)
                         CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                         in_stack_fffffffffffff988);
              pBVar2->mSampleLen = 0;
              pBVar2->mBuffer = (BufferStorage *)0x0;
              pBVar2->mSampleLen = (local_b8->mBuffer).mSampleLen;
              pBVar2->mBuffer = &local_b8->mBuffer;
              local_c0 = pBVar2;
              IncrementRef(&local_b8->ref);
              local_30->SourceType = 0x1028;
              local_30->queue = local_c0;
              local_98 = 0;
            }
            else {
              ALCcontext::setError
                        (local_38,0xa004,"Setting already-set callback buffer %u",
                         (ulong)local_b8->id);
              local_11 = 0;
              local_98 = 1;
            }
          }
          else {
            ALCcontext::setError
                      (local_38,0xa004,"Setting non-persistently mapped buffer %u",
                       (ulong)local_b8->id);
            local_11 = 0;
            local_98 = 1;
          }
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1622f5);
          if (local_98 != 0) goto LAB_001649e5;
        }
        while (local_58 != (__pointer_type)0x0) {
          std::unique_ptr<BufferlistItem,std::default_delete<BufferlistItem>>::
          unique_ptr<std::default_delete<BufferlistItem>,void>
                    ((unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> *)
                     CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                     in_stack_fffffffffffff988);
          std::unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_>::operator->
                    ((unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> *)0x162360);
          local_58 = std::atomic<BufferlistItem_*>::load
                               ((atomic<BufferlistItem_*> *)in_stack_fffffffffffff998,
                                in_stack_fffffffffffff994);
          pBVar3 = std::unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_>::operator->
                             ((unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> *)
                              0x16237f);
          local_d0 = pBVar3->mBuffer;
          if (local_d0 != (BufferStorage *)0x0) {
            pAVar4 = BufferFromStorage(local_d0);
            DecrementRef(&pAVar4->ref);
          }
          std::unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_>::~unique_ptr
                    ((unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> *)
                     CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
        }
        local_11 = 1;
        local_98 = 1;
      }
    }
    else {
      iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
      ALCcontext::setError
                (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_3c,1,
                 iVar5);
      local_11 = 0;
      local_98 = 1;
    }
    goto LAB_001649e5;
  }
  if ((local_3c != 0x100a) && (1 < local_3c - 0x100d)) {
    if (local_3c == 0x100f) {
      iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
      bVar13 = true;
      if (iVar5 != 6) {
        iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
        bVar13 = iVar5 == 6;
      }
      if (bVar13) {
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
        local_88 = (float)*piVar6;
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,1);
        local_84 = (float)*piVar6;
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,2);
        local_80 = (float)*piVar6;
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,3);
        local_7c = (float)*piVar6;
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,4);
        local_78 = (float)*piVar6;
        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,5);
        local_74 = (float)*piVar6;
        al::span<const_float,_18446744073709551615UL>::span(&local_198,&local_88,6);
        values_02.mData._7_1_ = in_stack_fffffffffffffc57;
        values_02.mData._0_7_ = in_stack_fffffffffffffc50;
        values_02.mDataEnd = in_stack_fffffffffffffc58;
        local_11 = SetSourcefv(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                               in_stack_fffffffffffffc3c,values_02);
        in_stack_fffffffffffff994 = CONCAT13(local_11,(int3)in_stack_fffffffffffff994);
        local_98 = 1;
      }
      else {
        iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
        ALCcontext::setError
                  (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_3c,6,
                   iVar5);
        local_11 = 0;
        local_98 = 1;
      }
      goto LAB_001649e5;
    }
    if ((local_3c == 0x1010) || (local_3c - 0x1015 < 2)) {
LAB_001619ff:
      ALCcontext::setError
                (local_38,0xa004,"Setting read-only source property 0x%04x",(ulong)local_3c);
      local_11 = 0;
      local_98 = 1;
      goto LAB_001649e5;
    }
    if (3 < local_3c - 0x1020) {
      if (local_3c - 0x1024 < 3) {
        iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
        bVar13 = true;
        if (iVar5 != 1) {
          iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
          bVar13 = iVar5 == 6;
        }
        if (bVar13) {
          piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
          if (*piVar6 < 0) {
            ALCcontext::setError(local_38,0xa003,"Value out of range");
            local_11 = 0;
            local_98 = 1;
          }
          else {
            local_d8 = GetSourceVoice(in_stack_fffffffffffff9c0,
                                      (ALCcontext *)in_stack_fffffffffffff9b8);
            if (local_d8 != (Voice *)0x0) {
              if ((local_d8->mFlags & 2) != 0) {
                ALCcontext::setError(local_38,0xa003,"Source offset for callback is invalid");
                local_11 = 0;
                local_98 = 1;
                goto LAB_001649e5;
              }
              al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
              GetSampleOffset(in_stack_fffffffffffffa38,OffsetType,
                              (double)CONCAT17(in_stack_fffffffffffffa2f,
                                               CONCAT16(in_stack_fffffffffffffa2e,
                                                        CONCAT24(in_stack_fffffffffffffa2c,
                                                                 in_stack_fffffffffffffa28))));
              al::optional<(anonymous_namespace)::VoicePos>::optional<true,_true>
                        ((optional<(anonymous_namespace)::VoicePos> *)in_stack_fffffffffffff9a0,
                         (optional<(anonymous_namespace)::VoicePos> *)in_stack_fffffffffffff998);
              al::optional<(anonymous_namespace)::VoicePos>::~optional
                        ((optional<(anonymous_namespace)::VoicePos> *)
                         CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
              bVar13 = al::optional::operator_cast_to_bool((optional *)&local_f0);
              if (bVar13) {
                al::optional<(anonymous_namespace)::VoicePos>::operator*(&local_f0);
                bVar13 = SetVoiceOffset(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                                        in_stack_fffffffffffffa98,
                                        (ALCcontext *)
                                        CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90
                                                ),in_stack_fffffffffffffa88);
                if (bVar13) {
                  local_11 = 1;
                  local_98 = 1;
                }
                else {
                  local_98 = 0;
                }
              }
              else {
                ALCcontext::setError(local_38,0xa003,"Invalid source offset");
                local_11 = 0;
                local_98 = 1;
              }
              al::optional<(anonymous_namespace)::VoicePos>::~optional
                        ((optional<(anonymous_namespace)::VoicePos> *)
                         CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
              if (local_98 != 0) goto LAB_001649e5;
            }
            local_30->OffsetType = local_3c;
            piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
            local_30->Offset = (double)*piVar6;
            local_11 = 1;
            local_98 = 1;
          }
        }
        else {
          iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
          ALCcontext::setError
                    (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_3c,
                     1,iVar5);
          local_11 = 0;
          local_98 = 1;
        }
        goto LAB_001649e5;
      }
      if (local_3c == 0x1027) goto LAB_001619ff;
      if (local_3c == 0x1030) {
LAB_00164974:
        if (0 < (int)gLogLevel) {
          fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",(ulong)local_3c);
        }
        ALCcontext::setError
                  (local_38,0xa002,"Invalid source integer property 0x%04x",(ulong)local_3c);
        local_11 = 0;
        local_98 = 1;
        goto LAB_001649e5;
      }
      if (local_3c != 0x1031) {
        if (local_3c == 0x1033) {
          iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
          bVar13 = true;
          if (iVar5 != 1) {
            iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
            bVar13 = iVar5 == 6;
          }
          if (!bVar13) {
            iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
            ALCcontext::setError
                      (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_3c,1,iVar5);
            local_11 = 0;
            local_98 = 1;
            goto LAB_001649e5;
          }
          al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
          DirectModeFromEnum(mode_00);
          al::optional<DirectMode>::optional<true,_true>
                    ((optional<DirectMode> *)in_stack_fffffffffffff9a0,
                     (optional<DirectMode> *)in_stack_fffffffffffff998);
          al::optional<DirectMode>::~optional
                    ((optional<DirectMode> *)
                     CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
          bVar13 = al::optional::operator_cast_to_bool((optional *)&local_11a);
          if (bVar13) {
            pDVar7 = al::optional<DirectMode>::operator*(&local_11a);
            local_30->DirectChannels = *pDVar7;
            local_11 = UpdateSourceProps(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
          }
          local_98 = (uint)bVar13;
          al::optional<DirectMode>::~optional
                    ((optional<DirectMode> *)
                     CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
          if (local_98 != 0) goto LAB_001649e5;
          this = local_38;
          puVar11 = (uint *)al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
          ALCcontext::setError
                    (this,0xa003,"Unsupported AL_DIRECT_CHANNELS_SOFT: 0x%04x\n",(ulong)*puVar11);
LAB_00163341:
          iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
          bVar13 = true;
          if (iVar5 != 1) {
            iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
            bVar13 = iVar5 == 6;
          }
          if (bVar13) {
            piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
            bVar13 = true;
            if (*piVar6 != 0) {
              piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
              bVar13 = true;
              if (*piVar6 != 0xd001) {
                piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                bVar13 = true;
                if (*piVar6 != 0xd002) {
                  piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                  bVar13 = true;
                  if (*piVar6 != 0xd003) {
                    piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                    bVar13 = true;
                    if (*piVar6 != 0xd004) {
                      piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                      bVar13 = true;
                      if (*piVar6 != 0xd005) {
                        piVar6 = al::span<const_int,_18446744073709551615UL>::operator[]
                                           (&local_28,0);
                        bVar13 = *piVar6 == 0xd006;
                      }
                    }
                  }
                }
              }
            }
            if (bVar13) {
              pDVar8 = (DistanceModel *)
                       al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
              local_30->mDistanceModel = *pDVar8;
              if ((local_38->mSourceDistanceModel & 1U) == 0) {
                local_11 = 1;
                local_98 = 1;
              }
              else {
                local_11 = UpdateSourceProps(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
                local_98 = 1;
              }
            }
            else {
              ALCcontext::setError(local_38,0xa003,"Value out of range");
              local_11 = 0;
              local_98 = 1;
            }
          }
          else {
            iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
            ALCcontext::setError
                      (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_3c,1,iVar5);
            local_11 = 0;
            local_98 = 1;
          }
          goto LAB_001649e5;
        }
        if (local_3c - 0x1200 < 4) goto LAB_00164974;
        if (local_3c == 0x1212) {
          iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
          bVar13 = true;
          if (iVar5 != 1) {
            iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
            bVar13 = iVar5 == 6;
          }
          if (bVar13) {
            piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
            bVar13 = false;
            if (-1 < *piVar6) {
              piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
              bVar13 = *piVar6 < 7;
            }
            if (bVar13) {
              pRVar9 = (Resampler *)
                       al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
              local_30->mResampler = *pRVar9;
              local_11 = UpdateSourceProps(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
              local_98 = 1;
            }
            else {
              ALCcontext::setError(local_38,0xa003,"Value out of range");
              local_11 = 0;
              local_98 = 1;
            }
          }
          else {
            iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
            ALCcontext::setError
                      (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_3c,1,iVar5);
            local_11 = 0;
            local_98 = 1;
          }
          goto LAB_001649e5;
        }
        if (local_3c == 0x1214) {
          iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
          bVar13 = true;
          if (iVar5 != 1) {
            iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
            bVar13 = iVar5 == 6;
          }
          if (bVar13) {
            al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
            SpatializeModeFromEnum(mode_00);
            al::optional<SpatializeMode>::optional<true,_true>
                      ((optional<SpatializeMode> *)in_stack_fffffffffffff9a0,
                       (optional<SpatializeMode> *)in_stack_fffffffffffff998);
            al::optional<SpatializeMode>::~optional
                      ((optional<SpatializeMode> *)
                       CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
            bVar13 = al::optional::operator_cast_to_bool((optional *)local_11e);
            if (bVar13) {
              pSVar10 = al::optional<SpatializeMode>::operator*(local_11e);
              local_30->mSpatialize = *pSVar10;
              local_11 = UpdateSourceProps(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
            }
            local_98 = (uint)bVar13;
            al::optional<SpatializeMode>::~optional
                      ((optional<SpatializeMode> *)
                       CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
            if (local_98 == 0) {
              puVar11 = (uint *)al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0)
              ;
              ALCcontext::setError
                        (local_38,0xa003,"Unsupported AL_SOURCE_SPATIALIZE_SOFT: 0x%04x\n",
                         (ulong)*puVar11);
              local_11 = 0;
              local_98 = 1;
            }
          }
          else {
            iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
            ALCcontext::setError
                      (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_3c,1,iVar5);
            local_11 = 0;
            local_98 = 1;
          }
          goto LAB_001649e5;
        }
        if (local_3c != 0xc000) {
          if (local_3c == 0xd000) goto LAB_00163341;
          if (local_3c == 0x20005) {
            iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
            AVar14 = (ALuint)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
            bVar13 = true;
            if (iVar5 != 1) {
              iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
              bVar13 = iVar5 == 6;
            }
            if (bVar13) {
              piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
              if (*piVar6 == 0) {
                (local_30->Direct).Gain = 1.0;
                (local_30->Direct).GainHF = 1.0;
                (local_30->Direct).HFReference = 5000.0;
                (local_30->Direct).GainLF = 1.0;
                (local_30->Direct).LFReference = 250.0;
              }
              else {
                std::lock_guard<std::mutex>::lock_guard
                          ((lock_guard<std::mutex> *)
                           CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                           (mutex_type *)in_stack_fffffffffffff988);
                al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                local_118 = LookupFilter(in_stack_fffffffffffff9b8,AVar14);
                bVar13 = local_118 != (ALfilter *)0x0;
                if (bVar13) {
                  (local_30->Direct).Gain = local_118->Gain;
                  (local_30->Direct).GainHF = local_118->GainHF;
                  (local_30->Direct).HFReference = local_118->HFReference;
                  (local_30->Direct).GainLF = local_118->GainLF;
                  (local_30->Direct).LFReference = local_118->LFReference;
                }
                else {
                  puVar11 = (uint *)al::span<const_int,_18446744073709551615UL>::operator[]
                                              (&local_28,0);
                  ALCcontext::setError(local_38,0xa003,"Invalid filter ID %u",(ulong)*puVar11);
                  local_11 = 0;
                }
                local_98 = (uint)!bVar13;
                std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x162a8a);
                if (local_98 != 0) goto LAB_001649e5;
              }
              local_11 = UpdateSourceProps(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
              local_98 = 1;
            }
            else {
              iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
              ALCcontext::setError
                        (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                         (ulong)local_3c,1,iVar5);
              local_11 = 0;
              local_98 = 1;
            }
            goto LAB_001649e5;
          }
          if (local_3c == 0x20006) {
            iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
            bVar13 = true;
            if (iVar5 != 3) {
              iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
              bVar13 = iVar5 == 6;
            }
            if (bVar13) {
              std::unique_lock<std::mutex>::unique_lock
                        ((unique_lock<std::mutex> *)
                         CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                         (mutex_type *)in_stack_fffffffffffff988);
              std::unique_lock<std::mutex>::operator=
                        ((unique_lock<std::mutex> *)in_stack_fffffffffffff9a0,
                         (unique_lock<std::mutex> *)in_stack_fffffffffffff998);
              std::unique_lock<std::mutex>::~unique_lock
                        ((unique_lock<std::mutex> *)
                         CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
              piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
              if (*piVar6 != 0) {
                al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                local_50 = LookupEffectSlot((ALCcontext *)in_stack_fffffffffffff9b8,
                                            (ALuint)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
                if (local_50 == (ALeffectslot *)0x0) {
                  puVar11 = (uint *)al::span<const_int,_18446744073709551615UL>::operator[]
                                              (&local_28,0);
                  ALCcontext::setError(local_38,0xa003,"Invalid effect ID %u",(ulong)*puVar11);
                  local_11 = 0;
                  local_98 = 1;
                  goto LAB_001649e5;
                }
              }
              puVar11 = (uint *)al::span<const_int,_18446744073709551615UL>::operator[](&local_28,1)
              ;
              if (*puVar11 < local_48->NumAuxSends) {
                piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,2);
                if (*piVar6 == 0) {
                  al::span<const_int,_18446744073709551615UL>::operator[](&local_28,1);
                  local_150 = std::array<ALsource::SendData,_6UL>::operator[]
                                        ((array<ALsource::SendData,_6UL> *)
                                         CONCAT44(in_stack_fffffffffffff994,
                                                  in_stack_fffffffffffff990),
                                         (size_type)in_stack_fffffffffffff988);
                  local_150->Gain = 1.0;
                  local_150->GainHF = 1.0;
                  local_150->HFReference = 5000.0;
                  local_150->GainLF = 1.0;
                  local_150->LFReference = 250.0;
                }
                else {
                  std::lock_guard<std::mutex>::lock_guard
                            ((lock_guard<std::mutex> *)
                             CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                             (mutex_type *)in_stack_fffffffffffff988);
                  al::span<const_int,_18446744073709551615UL>::operator[](&local_28,2);
                  local_140 = LookupFilter(in_stack_fffffffffffff9b8,
                                           (ALuint)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
                  bVar13 = local_140 != (ALfilter *)0x0;
                  if (bVar13) {
                    al::span<const_int,_18446744073709551615UL>::operator[](&local_28,1);
                    local_148 = std::array<ALsource::SendData,_6UL>::operator[]
                                          ((array<ALsource::SendData,_6UL> *)
                                           CONCAT44(in_stack_fffffffffffff994,
                                                    in_stack_fffffffffffff990),
                                           (size_type)in_stack_fffffffffffff988);
                    local_148->Gain = local_140->Gain;
                    local_148->GainHF = local_140->GainHF;
                    local_148->HFReference = local_140->HFReference;
                    local_148->GainLF = local_140->GainLF;
                    local_148->LFReference = local_140->LFReference;
                  }
                  else {
                    puVar11 = (uint *)al::span<const_int,_18446744073709551615UL>::operator[]
                                                (&local_28,2);
                    ALCcontext::setError(local_38,0xa003,"Invalid filter ID %u",(ulong)*puVar11);
                    local_11 = 0;
                  }
                  local_98 = (uint)!bVar13;
                  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x163f58);
                  if (local_98 != 0) goto LAB_001649e5;
                }
                pAVar16 = local_50;
                al::span<const_int,_18446744073709551615UL>::operator[](&local_28,1);
                pvVar12 = std::array<ALsource::SendData,_6UL>::operator[]
                                    ((array<ALsource::SendData,_6UL> *)
                                     CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                                     (size_type)in_stack_fffffffffffff988);
                if ((pAVar16 == pvVar12->Slot) || (bVar13 = IsPlayingOrPaused(local_30), !bVar13)) {
                  if (local_50 != (ALeffectslot *)0x0) {
                    IncrementRef(&local_50->ref);
                  }
                  al::span<const_int,_18446744073709551615UL>::operator[](&local_28,1);
                  pvVar12 = std::array<ALsource::SendData,_6UL>::operator[]
                                      ((array<ALsource::SendData,_6UL> *)
                                       CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990)
                                       ,(size_type)in_stack_fffffffffffff988);
                  local_168 = pvVar12->Slot;
                  if (local_168 != (ALeffectslot *)0x0) {
                    DecrementRef(&local_168->ref);
                  }
                  pAVar16 = local_50;
                  al::span<const_int,_18446744073709551615UL>::operator[](&local_28,1);
                  pvVar12 = std::array<ALsource::SendData,_6UL>::operator[]
                                      ((array<ALsource::SendData,_6UL> *)
                                       CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990)
                                       ,(size_type)in_stack_fffffffffffff988);
                  pvVar12->Slot = pAVar16;
                  UpdateSourceProps(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
                }
                else {
                  if (local_50 != (ALeffectslot *)0x0) {
                    IncrementRef(&local_50->ref);
                  }
                  al::span<const_int,_18446744073709551615UL>::operator[](&local_28,1);
                  pvVar12 = std::array<ALsource::SendData,_6UL>::operator[]
                                      ((array<ALsource::SendData,_6UL> *)
                                       CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990)
                                       ,(size_type)in_stack_fffffffffffff988);
                  local_158 = pvVar12->Slot;
                  if (local_158 != (ALeffectslot *)0x0) {
                    DecrementRef(&local_158->ref);
                  }
                  pAVar16 = local_50;
                  al::span<const_int,_18446744073709551615UL>::operator[](&local_28,1);
                  pvVar12 = std::array<ALsource::SendData,_6UL>::operator[]
                                      ((array<ALsource::SendData,_6UL> *)
                                       CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990)
                                       ,(size_type)in_stack_fffffffffffff988);
                  pvVar12->Slot = pAVar16;
                  local_160 = GetSourceVoice(in_stack_fffffffffffff9c0,
                                             (ALCcontext *)in_stack_fffffffffffff9b8);
                  if (local_160 == (Voice *)0x0) {
                    paVar15 = &local_30->PropsClean;
                    local_c = 3;
                    local_8 = paVar15;
                    local_10 = std::operator&(memory_order_release,__memory_order_mask);
                    if (local_c == 3) {
                      (paVar15->super___atomic_flag_base)._M_i = false;
                    }
                    else if (local_c == 5) {
                      LOCK();
                      (paVar15->super___atomic_flag_base)._M_i = false;
                      UNLOCK();
                    }
                    else {
                      (paVar15->super___atomic_flag_base)._M_i = false;
                    }
                  }
                  else {
                    UpdateSourceProps(in_stack_fffffffffffff9c0,(Voice *)in_stack_fffffffffffff9b8,
                                      in_stack_fffffffffffff9b0);
                  }
                }
                local_11 = 1;
                local_98 = 1;
              }
              else {
                puVar11 = (uint *)al::span<const_int,_18446744073709551615UL>::operator[]
                                            (&local_28,1);
                ALCcontext::setError(local_38,0xa003,"Invalid send %u",(ulong)*puVar11);
                local_11 = 0;
                local_98 = 1;
              }
            }
            else {
              iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
              ALCcontext::setError
                        (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                         (ulong)local_3c,3,iVar5);
              local_11 = 0;
              local_98 = 1;
            }
            goto LAB_001649e5;
          }
          if (2 < local_3c - 0x20007) {
            if (local_3c == 0x2000a) {
              iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
              bVar13 = true;
              if (iVar5 != 1) {
                iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
                bVar13 = iVar5 == 6;
              }
              if (bVar13) {
                piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                bVar13 = true;
                if (*piVar6 != 0) {
                  piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                  bVar13 = *piVar6 == 1;
                }
                if (bVar13) {
                  piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                  local_30->DryGainHFAuto = *piVar6 != 0;
                  local_11 = UpdateSourceProps(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
                  local_98 = 1;
                }
                else {
                  ALCcontext::setError(local_38,0xa003,"Value out of range");
                  local_11 = 0;
                  local_98 = 1;
                }
              }
              else {
                iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
                ALCcontext::setError
                          (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                           (ulong)local_3c,1,iVar5);
                local_11 = 0;
                local_98 = 1;
              }
              goto LAB_001649e5;
            }
            if (local_3c == 0x2000b) {
              iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
              bVar13 = true;
              if (iVar5 != 1) {
                iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
                bVar13 = iVar5 == 6;
              }
              if (bVar13) {
                piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                bVar13 = true;
                if (*piVar6 != 0) {
                  piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                  bVar13 = *piVar6 == 1;
                }
                if (bVar13) {
                  piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                  local_30->WetGainAuto = *piVar6 != 0;
                  local_11 = UpdateSourceProps(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
                  local_98 = 1;
                }
                else {
                  ALCcontext::setError(local_38,0xa003,"Value out of range");
                  local_11 = 0;
                  local_98 = 1;
                }
              }
              else {
                iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
                ALCcontext::setError
                          (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                           (ulong)local_3c,1,iVar5);
                local_11 = 0;
                local_98 = 1;
              }
              goto LAB_001649e5;
            }
            if (local_3c == 0x2000c) {
              iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
              bVar13 = true;
              if (iVar5 != 1) {
                iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
                bVar13 = iVar5 == 6;
              }
              if (bVar13) {
                piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                bVar13 = true;
                if (*piVar6 != 0) {
                  piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                  bVar13 = *piVar6 == 1;
                }
                if (bVar13) {
                  piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
                  local_30->WetGainHFAuto = *piVar6 != 0;
                  local_11 = UpdateSourceProps(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
                  local_98 = 1;
                }
                else {
                  ALCcontext::setError(local_38,0xa003,"Value out of range");
                  local_11 = 0;
                  local_98 = 1;
                }
              }
              else {
                iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
                ALCcontext::setError
                          (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                           (ulong)local_3c,1,iVar5);
                local_11 = 0;
                local_98 = 1;
              }
              goto LAB_001649e5;
            }
            goto LAB_00164974;
          }
        }
      }
    }
  }
LAB_001643dd:
  iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
  bVar13 = true;
  if (iVar5 != 1) {
    iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
    bVar13 = iVar5 == 6;
  }
  if (bVar13) {
    piVar6 = al::span<const_int,_18446744073709551615UL>::operator[](&local_28,0);
    local_88 = (float)*piVar6;
    al::span<const_float,_18446744073709551615UL>::span(&local_178,&local_88,1);
    values_00.mData._7_1_ = in_stack_fffffffffffffc57;
    values_00.mData._0_7_ = in_stack_fffffffffffffc50;
    values_00.mDataEnd = in_stack_fffffffffffffc58;
    local_11 = SetSourcefv(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                           in_stack_fffffffffffffc3c,values_00);
    local_98 = 1;
  }
  else {
    iVar5 = al::span<const_int,_18446744073709551615UL>::size(&local_28);
    ALCcontext::setError
              (local_38,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_3c,1,
               iVar5);
    local_11 = 0;
    local_98 = 1;
  }
LAB_001649e5:
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
  return (bool)(local_11 & 1);
}

Assistant:

bool SetSourceiv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<const int> values)
{
    ALCdevice *device{Context->mDevice.get()};
    ALeffectslot *slot{nullptr};
    BufferlistItem *oldlist{nullptr};
    std::unique_lock<std::mutex> slotlock;
    float fvals[6];

    switch(prop)
    {
    case AL_SOURCE_STATE:
    case AL_SOURCE_TYPE:
    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
        /* Query only */
        SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
            "Setting read-only source property 0x%04x", prop);

    case AL_SOURCE_RELATIVE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->HeadRelative = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_LOOPING:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->Looping = values[0] != AL_FALSE;
        if(IsPlayingOrPaused(Source))
        {
            if(Voice *voice{GetSourceVoice(Source, Context)})
            {
                if(Source->Looping)
                    voice->mLoopBuffer.store(Source->queue, std::memory_order_release);
                else
                    voice->mLoopBuffer.store(nullptr, std::memory_order_release);

                /* If the source is playing, wait for the current mix to finish
                 * to ensure it isn't currently looping back or reaching the
                 * end.
                 */
                device->waitForMix();
            }
        }
        return true;

    case AL_BUFFER:
        CHECKSIZE(values, 1);
        {
            const ALenum state{GetSourceState(Source, GetSourceVoice(Source, Context))};
            if(state == AL_PLAYING || state == AL_PAUSED)
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting buffer on playing or paused source %u", Source->id);
        }
        oldlist = Source->queue;
        if(values[0])
        {
            std::lock_guard<std::mutex> _{device->BufferLock};
            ALbuffer *buffer{LookupBuffer(device, static_cast<ALuint>(values[0]))};
            if(!buffer)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid buffer ID %u",
                    static_cast<ALuint>(values[0]));
            if(buffer->MappedAccess && !(buffer->MappedAccess&AL_MAP_PERSISTENT_BIT_SOFT))
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting non-persistently mapped buffer %u", buffer->id);
            if(buffer->mBuffer.mCallback && ReadRef(buffer->ref) != 0)
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting already-set callback buffer %u", buffer->id);

            /* Add the selected buffer to a one-item queue */
            auto newlist = new BufferlistItem{};
            newlist->mSampleLen = buffer->mBuffer.mSampleLen;
            newlist->mBuffer = &buffer->mBuffer;
            IncrementRef(buffer->ref);

            /* Source is now Static */
            Source->SourceType = AL_STATIC;
            Source->queue = newlist;
        }
        else
        {
            /* Source is now Undetermined */
            Source->SourceType = AL_UNDETERMINED;
            Source->queue = nullptr;
        }

        /* Delete all elements in the previous queue */
        while(oldlist != nullptr)
        {
            std::unique_ptr<BufferlistItem> temp{oldlist};
            oldlist = temp->mNext.load(std::memory_order_relaxed);

            if(BufferStorage *buffer{temp->mBuffer})
                DecrementRef(BufferFromStorage(buffer)->ref);
        }
        return true;

    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0);

        if(Voice *voice{GetSourceVoice(Source, Context)})
        {
            if((voice->mFlags&VoiceIsCallback))
                SETERR_RETURN(Context, AL_INVALID_VALUE, false,
                    "Source offset for callback is invalid");
            auto vpos = GetSampleOffset(Source->queue, prop, values[0]);
            if(!vpos) SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid source offset");

            if(SetVoiceOffset(voice, *vpos, Source, Context, device))
                return true;
        }
        Source->OffsetType = prop;
        Source->Offset = values[0];
        return true;

    case AL_DIRECT_FILTER:
        CHECKSIZE(values, 1);
        if(values[0])
        {
            std::lock_guard<std::mutex> _{device->FilterLock};
            ALfilter *filter{LookupFilter(device, static_cast<ALuint>(values[0]))};
            if(!filter)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid filter ID %u",
                    static_cast<ALuint>(values[0]));
            Source->Direct.Gain = filter->Gain;
            Source->Direct.GainHF = filter->GainHF;
            Source->Direct.HFReference = filter->HFReference;
            Source->Direct.GainLF = filter->GainLF;
            Source->Direct.LFReference = filter->LFReference;
        }
        else
        {
            Source->Direct.Gain = 1.0f;
            Source->Direct.GainHF = 1.0f;
            Source->Direct.HFReference = LOWPASSFREQREF;
            Source->Direct.GainLF = 1.0f;
            Source->Direct.LFReference = HIGHPASSFREQREF;
        }
        return UpdateSourceProps(Source, Context);

    case AL_DIRECT_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->DryGainHFAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->WetGainAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->WetGainHFAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_DIRECT_CHANNELS_SOFT:
        CHECKSIZE(values, 1);
        if(auto mode = DirectModeFromEnum(values[0]))
        {
            Source->DirectChannels = *mode;
            return UpdateSourceProps(Source, Context);
        }
        Context->setError(AL_INVALID_VALUE, "Unsupported AL_DIRECT_CHANNELS_SOFT: 0x%04x\n",
            values[0]);

    case AL_DISTANCE_MODEL:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_NONE ||
            values[0] == AL_INVERSE_DISTANCE || values[0] == AL_INVERSE_DISTANCE_CLAMPED ||
            values[0] == AL_LINEAR_DISTANCE || values[0] == AL_LINEAR_DISTANCE_CLAMPED ||
            values[0] == AL_EXPONENT_DISTANCE || values[0] == AL_EXPONENT_DISTANCE_CLAMPED);

        Source->mDistanceModel = static_cast<DistanceModel>(values[0]);
        if(Context->mSourceDistanceModel)
            return UpdateSourceProps(Source, Context);
        return true;

    case AL_SOURCE_RESAMPLER_SOFT:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0 && values[0] <= static_cast<int>(Resampler::Max));

        Source->mResampler = static_cast<Resampler>(values[0]);
        return UpdateSourceProps(Source, Context);

    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        if(auto mode = SpatializeModeFromEnum(values[0]))
        {
            Source->mSpatialize = *mode;
            return UpdateSourceProps(Source, Context);
        }
        Context->setError(AL_INVALID_VALUE, "Unsupported AL_SOURCE_SPATIALIZE_SOFT: 0x%04x\n",
            values[0]);
        return false;

    case AL_AUXILIARY_SEND_FILTER:
        CHECKSIZE(values, 3);
        slotlock = std::unique_lock<std::mutex>{Context->mEffectSlotLock};
        if(values[0] && (slot=LookupEffectSlot(Context, static_cast<ALuint>(values[0]))) == nullptr)
            SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid effect ID %u", values[0]);
        if(static_cast<ALuint>(values[1]) >= device->NumAuxSends)
            SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid send %u", values[1]);

        if(values[2])
        {
            std::lock_guard<std::mutex> _{device->FilterLock};
            ALfilter *filter{LookupFilter(device, static_cast<ALuint>(values[2]))};
            if(!filter)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid filter ID %u", values[2]);

            auto &send = Source->Send[static_cast<ALuint>(values[1])];
            send.Gain = filter->Gain;
            send.GainHF = filter->GainHF;
            send.HFReference = filter->HFReference;
            send.GainLF = filter->GainLF;
            send.LFReference = filter->LFReference;
        }
        else
        {
            /* Disable filter */
            auto &send = Source->Send[static_cast<ALuint>(values[1])];
            send.Gain = 1.0f;
            send.GainHF = 1.0f;
            send.HFReference = LOWPASSFREQREF;
            send.GainLF = 1.0f;
            send.LFReference = HIGHPASSFREQREF;
        }

        if(slot != Source->Send[static_cast<ALuint>(values[1])].Slot && IsPlayingOrPaused(Source))
        {
            /* Add refcount on the new slot, and release the previous slot */
            if(slot) IncrementRef(slot->ref);
            if(auto *oldslot = Source->Send[static_cast<ALuint>(values[1])].Slot)
                DecrementRef(oldslot->ref);
            Source->Send[static_cast<ALuint>(values[1])].Slot = slot;

            /* We must force an update if the auxiliary slot changed on an
             * active source, in case the slot is about to be deleted.
             */
            Voice *voice{GetSourceVoice(Source, Context)};
            if(voice) UpdateSourceProps(Source, voice, Context);
            else Source->PropsClean.clear(std::memory_order_release);
        }
        else
        {
            if(slot) IncrementRef(slot->ref);
            if(auto *oldslot = Source->Send[static_cast<ALuint>(values[1])].Slot)
                DecrementRef(oldslot->ref);
            Source->Send[static_cast<ALuint>(values[1])].Slot = slot;
            UpdateSourceProps(Source, Context);
        }
        return true;


    /* 1x float */
    case AL_CONE_INNER_ANGLE:
    case AL_CONE_OUTER_ANGLE:
    case AL_PITCH:
    case AL_GAIN:
    case AL_MIN_GAIN:
    case AL_MAX_GAIN:
    case AL_REFERENCE_DISTANCE:
    case AL_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAIN:
    case AL_MAX_DISTANCE:
    case AL_DOPPLER_FACTOR:
    case AL_CONE_OUTER_GAINHF:
    case AL_AIR_ABSORPTION_FACTOR:
    case AL_ROOM_ROLLOFF_FACTOR:
    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        fvals[0] = static_cast<float>(values[0]);
        return SetSourcefv(Source, Context, prop, {fvals, 1u});

    /* 3x float */
    case AL_POSITION:
    case AL_VELOCITY:
    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        return SetSourcefv(Source, Context, prop, {fvals, 3u});

    /* 6x float */
    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        fvals[3] = static_cast<float>(values[3]);
        fvals[4] = static_cast<float>(values[4]);
        fvals[5] = static_cast<float>(values[5]);
        return SetSourcefv(Source, Context, prop, {fvals, 6u});

    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
    case AL_STEREO_ANGLES:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source integer property 0x%04x", prop);
    return false;
}